

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeSolver.h
# Opt level: O0

void pica::YeeSolver::Implementation<(pica::Dimension)3,_double>::updateB
               (YeeGrid<(pica::Dimension)3,_double> *grid,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Grid<(pica::Dimension)3,_double> *pGVar5;
  ValueType *pVVar6;
  void *in_RSI;
  Grid<(pica::Dimension)3,_double> *in_RDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double dVar7;
  double dVar8;
  IndexType IVar9;
  int k_2;
  int j_2;
  int k_1;
  int i_2;
  int j_1;
  int i_1;
  int k;
  int j;
  int i;
  IndexType end;
  IndexType begin;
  PositionType coeff;
  ValueType cdt;
  Vector3<double> *in_stack_fffffffffffffe18;
  Vector3<double> *in_stack_fffffffffffffe20;
  ValueType in_stack_fffffffffffffe28;
  Grid<(pica::Dimension)3,_double> *in_stack_fffffffffffffe30;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_80;
  int local_78;
  int iStack_74;
  Vector3<int> local_6c;
  PositionType local_60;
  Vector3<double> local_48;
  double local_30;
  Grid<(pica::Dimension)3,_double> *local_28;
  double local_20;
  double local_18;
  double local_10;
  Grid<(pica::Dimension)3,_double> *local_8;
  
  local_10 = in_XMM0_Qa;
  local_8 = in_RDI;
  Constants<double>::c(in_RDI,in_RSI);
  local_18 = extraout_XMM0_Qa * local_10;
  Vector3<double>::Vector3(&local_48,local_18,local_18,local_18);
  Grid<(pica::Dimension)3,_double>::getStep(&local_60,local_8);
  operator/(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Vector3<int>::Vector3(&local_6c,1,1,1);
  IVar9 = Grid<(pica::Dimension)3,_double>::getSize(in_stack_fffffffffffffe30);
  local_80 = IVar9.z;
  for (local_8c = local_6c.x; local_78 = IVar9.x, iStack_74 = IVar9.y, local_8c < local_78;
      local_8c = local_8c + 1) {
    for (local_90 = local_6c.y; local_90 < iStack_74; local_90 = local_90 + 1) {
      for (local_94 = local_6c.z; dVar3 = local_20, local_94 < local_80; local_94 = local_94 + 1) {
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ey
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar7 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ey
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        pGVar5 = local_28;
        dVar8 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ez
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar1 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ez
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar2 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::bx
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar4 = local_30;
        *pVVar6 = dVar3 * (dVar7 - dVar8) + -((double)pGVar5 * (dVar1 - dVar2)) + *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ez
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar3 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ez
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar2 = local_20;
        dVar7 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ex
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar8 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ex
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar1 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::by
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        pGVar5 = local_28;
        *pVVar6 = dVar4 * (dVar3 - dVar7) + -(dVar2 * (dVar8 - dVar1)) + *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ex
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar3 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ex
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar2 = local_30;
        dVar7 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ey
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar8 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ey
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        dVar1 = *pVVar6;
        pVVar6 = YeeGrid<(pica::Dimension)3,_double>::bz
                           ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                            (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                            SUB84(in_stack_fffffffffffffe28,0),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        *pVVar6 = (double)pGVar5 * (dVar3 - dVar7) + -(dVar2 * (dVar8 - dVar1)) + *pVVar6;
      }
    }
  }
  for (local_98 = local_6c.x; local_98 < local_78; local_98 = local_98 + 1) {
    for (local_9c = local_6c.y; pGVar5 = local_28, local_9c < iStack_74; local_9c = local_9c + 1) {
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ex
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      dVar3 = *pVVar6;
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ex
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      dVar2 = local_30;
      dVar7 = *pVVar6;
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ey
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      dVar8 = *pVVar6;
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ey
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      dVar1 = *pVVar6;
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::bz
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      *pVVar6 = (double)pGVar5 * (dVar3 - dVar7) + -(dVar2 * (dVar8 - dVar1)) + *pVVar6;
    }
  }
  for (local_a0 = local_6c.x; local_a0 < local_78; local_a0 = local_a0 + 1) {
    for (local_a4 = local_6c.z; dVar3 = local_30, local_a4 < local_80; local_a4 = local_a4 + 1) {
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ez
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      dVar7 = *pVVar6;
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ez
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      dVar4 = local_20;
      dVar8 = *pVVar6;
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ex
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      dVar1 = *pVVar6;
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ex
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      dVar2 = *pVVar6;
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::by
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      *pVVar6 = dVar3 * (dVar7 - dVar8) + -(dVar4 * (dVar1 - dVar2)) + *pVVar6;
    }
  }
  for (local_a8 = local_6c.y; local_a8 < iStack_74; local_a8 = local_a8 + 1) {
    for (local_ac = local_6c.z; dVar3 = local_20, local_ac < local_80; local_ac = local_ac + 1) {
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ey
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      in_stack_fffffffffffffe20 = (Vector3<double> *)*pVVar6;
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ey
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      dVar7 = (double)in_stack_fffffffffffffe20 - *pVVar6;
      in_stack_fffffffffffffe30 = local_28;
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ez
                         ((YeeGrid<(pica::Dimension)3,_double> *)local_28,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      in_stack_fffffffffffffe28 = *pVVar6;
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::ez
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      dVar8 = (double)in_stack_fffffffffffffe30 * (in_stack_fffffffffffffe28 - *pVVar6);
      pVVar6 = YeeGrid<(pica::Dimension)3,_double>::bx
                         ((YeeGrid<(pica::Dimension)3,_double> *)in_stack_fffffffffffffe30,
                          (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0),
                          (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      *pVVar6 = dVar3 * dVar7 + -dVar8 + *pVVar6;
    }
  }
  return;
}

Assistant:

static void updateB(YeeGrid<Three, Real>& grid, Real dt)
    {
        typedef typename YeeGrid<Three, Real>::ValueType ValueType;
        typedef typename YeeGrid<Three, Real>::PositionType PositionType;
        const ValueType cdt = Constants<ValueType>::c() * dt;
        const PositionType coeff = PositionType(cdt, cdt, cdt) / grid.getStep();
        typedef typename YeeGrid<Three, Real>::IndexType IndexType;
        const IndexType begin(1, 1, 1);
        const IndexType end = grid.getSize();
        #pragma omp parallel for collapse(2)
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++) {
            grid.bx(i, j, k) += coeff.z * (grid.ey(i, j, k) - grid.ey(i, j, k - 1)) -
                coeff.y * (grid.ez(i, j, k) - grid.ez(i, j - 1, k));
            grid.by(i, j, k) += coeff.x * (grid.ez(i, j, k) - grid.ez(i - 1, j, k)) -
                coeff.z * (grid.ex(i, j, k) - grid.ex(i, j, k - 1));
            grid.bz(i, j, k) += coeff.y * (grid.ex(i, j, k) - grid.ex(i, j - 1, k)) -
                coeff.x * (grid.ey(i, j, k) - grid.ey(i - 1, j, k));
        }
        // Edges
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
            grid.bz(i, j, 0) += coeff.y * (grid.ex(i, j, 0) - grid.ex(i, j - 1, 0)) -
                coeff.x * (grid.ey(i, j, 0) - grid.ey(i - 1, j, 0));
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int k = begin.z; k < end.z; k++)
            grid.by(i, 0, k) += coeff.x * (grid.ez(i, 0, k) - grid.ez(i - 1, 0, k)) -
                coeff.z * (grid.ex(i, 0, k) - grid.ex(i, 0, k - 1));
        #pragma omp parallel for
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++)
            grid.bx(0, j, k) += coeff.z * (grid.ey(0, j, k) - grid.ey(0, j, k - 1)) -
                coeff.y * (grid.ez(0, j, k) - grid.ez(0, j - 1, k));
    }